

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::PointInstancer>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               PointInstancer *instancer,string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *__lhs;
  Property *this;
  _Base_ptr *this_00;
  double t;
  pointer pSVar1;
  allocator aVar2;
  ostringstream oVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  uint uVar7;
  int iVar8;
  size_type sVar9;
  value_type *pvVar10;
  _Base_ptr p_Var11;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar12;
  value_type *value;
  mapped_type *this_01;
  _Base_ptr p_Var13;
  ostream *poVar14;
  Property *pPVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  string *__v;
  Property *args_1;
  long lVar18;
  undefined4 in_stack_fffffffffffffb4c;
  allocator local_489;
  ParseResult ret_3;
  ParseResult ret;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_408;
  optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> local_3f8;
  AttrMetas *local_3d8;
  TimeSamples *local_3d0;
  PointInstancer *local_3c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_318;
  string attr_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
  local_298 [11];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = (uint)options->strict_allowedToken_check;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&instancer->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar4) {
    p_Var13 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3d8 = &(instancer->orientations)._metas;
    local_3c8 = instancer;
    while( true ) {
      bVar4 = (_Rb_tree_header *)p_Var13 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar4) break;
      __lhs = p_Var13 + 1;
      bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"prototypes");
      if (bVar5) {
        ::std::__cxx11::string::string((string *)&ss_e,"prototypes",(allocator *)&ret);
        sVar9 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar9 == 0) {
          if (((ulong)p_Var13[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar14 = ::std::operator<<(poVar14,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar14 = ::std::operator<<(poVar14,":");
            poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
            poVar14 = ::std::operator<<(poVar14,"():");
            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf54);
            ::std::operator<<(poVar14," ");
            ::std::__cxx11::string::string
                      ((string *)&ret_3,"`{}` must be a Relationship",(allocator *)local_418);
            fmt::format<char[11]>((string *)&ret,(string *)&ret_3,(char (*) [11])"prototypes");
            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar14,"\n");
            ::std::__cxx11::string::_M_dispose();
LAB_001d178a:
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret_3,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            goto LAB_001d17ec;
          }
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (&instancer->prototypes,(Relationship *)&p_Var13[0x17]._M_left);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
        }
      }
      else {
        ::std::__cxx11::string::string(local_50,(string *)__lhs);
        this = (Property *)(p_Var13 + 2);
        ::std::__cxx11::string::string((string *)&ss_e,"protoIndices",(allocator *)&ret_3);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,(string *)this,(Property *)&ss_e,(string *)&instancer->protoIndices,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_fffffffffffffb4c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar8 = 3;
LAB_001d01e1:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar14 = ::std::operator<<(poVar14,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar14 = ::std::operator<<(poVar14,":");
            poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
            poVar14 = ::std::operator<<(poVar14,"():");
            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf55);
            ::std::operator<<(poVar14," ");
            ::std::__cxx11::string::string
                      ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_3f8);
            fmt::format<char[13],std::__cxx11::string>
                      ((string *)&ret_3,(fmt *)local_418,(string *)"protoIndices",
                       (char (*) [13])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
            ::std::operator<<(poVar14,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_418,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar8 = 1;
            goto LAB_001d01e1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (bVar5) {
          ::std::__cxx11::string::string(local_70,(string *)__lhs);
          ::std::__cxx11::string::string((string *)&ss_e,"ids",(allocator *)&ret_3);
          pPVar15 = (Property *)&ss_e;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                    (&ret,(_anonymous_namespace_ *)&table,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,(string *)this,(Property *)&ss_e,(string *)&instancer->ids,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          iVar8 = 0;
          if ((ret.code & ~AlreadyProcessed) == Success) {
            iVar8 = 3;
LAB_001d03a2:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (ret.code != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar14 = ::std::operator<<(poVar14,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar14 = ::std::operator<<(poVar14,":");
              poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
              poVar14 = ::std::operator<<(poVar14,"():");
              poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf56);
              ::std::operator<<(poVar14," ");
              ::std::__cxx11::string::string
                        ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                         (allocator *)&local_3f8);
              fmt::format<char[4],std::__cxx11::string>
                        ((string *)&ret_3,(fmt *)local_418,(string *)"ids",(char (*) [4])&ret.err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar15);
              poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
              ::std::operator<<(poVar14,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret_3,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_418,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar8 = 1;
              goto LAB_001d03a2;
            }
          }
          ::std::__cxx11::string::_M_dispose();
          if (bVar5) {
            ::std::__cxx11::string::string(local_90,(string *)__lhs);
            ::std::__cxx11::string::string((string *)&ss_e,"positions",(allocator *)&ret_3);
            pPVar15 = this;
            args_1 = (Property *)&ss_e;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (&ret,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_90,(string *)this,(Property *)&ss_e,(string *)&instancer->positions,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar8 = 0;
            if ((ret.code & ~AlreadyProcessed) == Success) {
              iVar8 = 3;
LAB_001d0563:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (ret.code != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf57);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                           (allocator *)&local_3f8);
                pPVar15 = (Property *)&ret.err;
                fmt::format<char[10],std::__cxx11::string>
                          ((string *)&ret_3,(fmt *)local_418,(string *)"positions",
                           (char (*) [10])pPVar15,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                ::std::operator<<(poVar14,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret_3,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_418,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                iVar8 = 1;
                goto LAB_001d0563;
              }
            }
            ::std::__cxx11::string::_M_dispose();
            if (bVar5) {
              ::std::__cxx11::string::string((string *)&local_2d8,(string *)__lhs);
              ::std::__cxx11::string::string((string *)&local_318,"orientations",&local_489);
              ret_3.err._M_dataplus._M_p = (pointer)&ret_3.err.field_2;
              ret_3.err._M_string_length = 0;
              ret_3.err.field_2._M_local_buf[0] = '\0';
              iVar8 = ::std::__cxx11::string::compare((string *)&local_2d8);
              if (iVar8 == 0) {
                if (((ulong)p_Var13[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  ret_3.code = PropertyTypeMismatch;
                  ::std::__cxx11::string::string
                            ((string *)&ret,
                             "Property `{}` must be Attribute, but declared as Relationship.",
                             (allocator *)local_418);
                  fmt::format<std::__cxx11::string>
                            ((string *)&ss_e,(fmt *)&ret,&local_318,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar15);
                  ::std::__cxx11::string::operator=((string *)&ret_3.err,(string *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                if (p_Var13[6]._M_left != p_Var13[6]._M_parent) {
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &(instancer->orientations)._paths,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var13[6]._M_parent);
                  ret_3.code = Success;
                }
                Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
                tinyusdz::value::
                TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                ::type_name_abi_cxx11_();
                _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ss_e,&attr_type_name);
                if (_Var6) {
                  ::std::__cxx11::string::_M_dispose();
LAB_001d06d0:
                  iVar8 = *(int *)((long)&p_Var13[0x17]._M_parent + 4);
                  if (iVar8 == 1) {
                    bVar5 = Attribute::is_blocked((Attribute *)this);
                    if (bVar5) {
                      (local_3c8->orientations)._blocked = true;
                    }
                    this_00 = &p_Var13[4]._M_parent;
                    bVar5 = primvar::PrimVar::has_value((PrimVar *)this_00);
                    if ((bVar5) || (p_Var13[5]._M_left != p_Var13[5]._M_parent)) {
                      local_298[0]._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      local_298[0]._17_8_ = 0;
                      local_298[0]._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_298[0]._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                      local_298[0]._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                      aStack_2a8._M_allocated_capacity._0_2_ = 0;
                      aStack_2a8._2_8_ = 0;
                      _ss_e = (pointer)0x0;
                      bVar5 = primvar::PrimVar::is_valid((PrimVar *)this_00);
                      if (bVar5) {
                        bVar5 = primvar::PrimVar::has_value((PrimVar *)this_00);
                        if (!bVar5) {
                          p_Var16 = p_Var13[5]._M_parent;
                          p_Var11 = p_Var13[5]._M_left;
                          if (p_Var11 != p_Var16) goto LAB_001d09aa;
                          goto LAB_001d0b2c;
                        }
                        primvar::PrimVar::
                        get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                  (&local_3f8,(PrimVar *)this_00);
                        bVar5 = local_3f8.has_value_;
                        local_418[0] = (allocator)local_3f8.has_value_;
                        if ((allocator)local_3f8.has_value_ == (allocator)0x1) {
                          local_418._8_8_ = local_3f8.contained.data.__align;
                          aStack_408._M_allocated_capacity = local_3f8.contained._8_8_;
                          aStack_408._8_8_ = local_3f8.contained._16_8_;
                          local_3f8.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_3f8.contained._8_8_ = 0;
                          local_3f8.contained._16_8_ = 0;
                          nonstd::optional_lite::
                          optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                          ::~optional(&local_3f8);
                          pvVar10 = nonstd::optional_lite::
                                    optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                    ::value((optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                             *)local_418);
                          Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                          ::set((Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                 *)&ss_e,pvVar10);
                        }
                        else {
                          nonstd::optional_lite::
                          optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                          ::~optional(&local_3f8);
                        }
                        nonstd::optional_lite::
                        optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                        ::~optional((optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                     *)local_418);
                        p_Var16 = p_Var13[5]._M_parent;
                        p_Var11 = p_Var13[5]._M_left;
                        if (p_Var11 == p_Var16) {
                          if ((allocator)bVar5 == (allocator)0x0) goto LAB_001d0b2c;
                        }
                        else {
LAB_001d09aa:
                          local_3d0 = (TimeSamples *)&p_Var13[5]._M_parent;
                          lVar18 = 0;
                          for (uVar17 = 0; uVar17 < (ulong)(((long)p_Var11 - (long)p_Var16) / 0x28);
                              uVar17 = uVar17 + 1) {
                            pvVar12 = tinyusdz::value::TimeSamples::get_samples(local_3d0);
                            pSVar1 = (pvVar12->
                                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            if ((&pSVar1->blocked)[lVar18] == true) {
                              TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                              ::add_blocked_sample(local_298,*(double *)((long)&pSVar1->t + lVar18))
                              ;
                            }
                            else {
                              tinyusdz::value::Value::
                              get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                        (&local_3f8,
                                         (Value *)((long)&(pSVar1->value).v_.storage + lVar18),false
                                        );
                              local_418[0] = (allocator)local_3f8.has_value_;
                              if ((allocator)local_3f8.has_value_ == (allocator)0x1) {
                                local_418._8_8_ = local_3f8.contained.data.__align;
                                aStack_408._M_allocated_capacity = local_3f8.contained._8_8_;
                                aStack_408._8_8_ = local_3f8.contained._16_8_;
                                local_3f8.contained.data.__align =
                                     (anon_struct_8_0_00000001_for___align)0x0;
                                local_3f8.contained._8_8_ = 0;
                                local_3f8.contained._16_8_ = 0;
                              }
                              nonstd::optional_lite::
                              optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                              ::~optional(&local_3f8);
                              aVar2 = local_418[0];
                              if (local_418[0] == (allocator)0x1) {
                                t = *(double *)((long)&pSVar1->t + lVar18);
                                pvVar10 = nonstd::optional_lite::
                                          optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                          ::value((
                                                  optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                                  *)local_418);
                                TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                ::add_sample(local_298,t,pvVar10);
                              }
                              else {
                                ret.err.field_2._M_allocated_capacity = 0;
                                ret.err.field_2._8_8_ = 0;
                                ret.err._M_dataplus._M_p = (pointer)0x0;
                                ret.err._M_string_length = 0;
                              }
                              nonstd::optional_lite::
                              optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                              ::~optional((optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                           *)local_418);
                              if (aVar2 == (allocator)0x0) {
                                ret.code = ret.code & 0xffffff00;
                                goto LAB_001d0b48;
                              }
                            }
                            p_Var16 = p_Var13[5]._M_parent;
                            p_Var11 = p_Var13[5]._M_left;
                            lVar18 = lVar18 + 0x28;
                          }
                          ret.code = ret.code & 0xffffff00;
                        }
                        nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                        ::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>,_0>
                                  ((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                    *)&ret,(Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                            *)&ss_e);
                      }
                      else {
LAB_001d0b2c:
                        ret.code = ret.code & 0xffffff00;
                        ret.err.field_2._M_allocated_capacity = 0;
                        ret.err.field_2._8_8_ = 0;
                        ret.err._M_dataplus._M_p = (pointer)0x0;
                        ret.err._M_string_length = 0;
                      }
LAB_001d0b48:
                      Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                      ::~Animatable((Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                     *)&ss_e);
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                      ::
                      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>,_0>
                                ((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                  *)&ss_e,(optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                           *)&ret);
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                      ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                   *)&ret);
                      oVar3 = ss_e;
                      if (ss_e == (ostringstream)0x1) {
                        value = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                         *)&ss_e);
                        nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                        ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                                     *)&(instancer->orientations)._attrib,value);
                      }
                      else {
                        ret_3.code = InternalError;
                        ::std::__cxx11::string::assign((char *)&ret_3.err);
                      }
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                      ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                   *)&ss_e);
                      if (oVar3 == (ostringstream)0x0) goto LAB_001d0be4;
                      goto LAB_001d0bb6;
                    }
                    if (p_Var13[6]._M_left == p_Var13[6]._M_parent) goto LAB_001d0be4;
                    AttrMetas::operator=(local_3d8,(AttrMetas *)(p_Var13 + 7));
                    __v = (string *)&local_2d8;
                  }
                  else {
                    if (iVar8 != 0) {
                      ::std::__cxx11::string::assign((char *)&ret_3.err);
                      ret_3.code = InternalError;
                      goto LAB_001d0be4;
                    }
                    (local_3c8->orientations)._value_empty = true;
LAB_001d0bb6:
                    AttrMetas::operator=(local_3d8,(AttrMetas *)(p_Var13 + 7));
                    __v = &local_318;
                  }
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&table,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                  ret_3.code = Success;
                }
                else {
                  tinyusdz::value::
                  TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                  ::underlying_type_name_abi_cxx11_();
                  _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret,&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (_Var6) goto LAB_001d06d0;
                  ret_3.code = TypeMismatch;
                  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
                  poVar14 = ::std::operator<<((ostream *)aStack_2a8._M_local_buf,
                                              "Property type mismatch. ");
                  poVar14 = ::std::operator<<(poVar14,(string *)&local_318);
                  poVar14 = ::std::operator<<(poVar14," expects type `");
                  tinyusdz::value::
                  TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                  ::type_name_abi_cxx11_();
                  poVar14 = ::std::operator<<(poVar14,(string *)&ret);
                  poVar14 = ::std::operator<<(poVar14,"` but defined as type `");
                  poVar14 = ::std::operator<<(poVar14,(string *)&attr_type_name);
                  ::std::operator<<(poVar14,"`");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::operator=((string *)&ret_3.err,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
                }
LAB_001d0be4:
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                ret_3.code = Unmatched;
              }
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              iVar8 = 0;
              if ((ret_3.code & ~AlreadyProcessed) == Success) {
                iVar8 = 3;
LAB_001d0d57:
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if (ret_3.code != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar14 = ::std::operator<<(poVar14,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar14 = ::std::operator<<(poVar14,":");
                  poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                  poVar14 = ::std::operator<<(poVar14,"():");
                  poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf58);
                  ::std::operator<<(poVar14," ");
                  ::std::__cxx11::string::string
                            ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                             (allocator *)&local_3f8);
                  fmt::format<char[13],std::__cxx11::string>
                            ((string *)&ret,(fmt *)local_418,(string *)"orientations",
                             (char (*) [13])&ret_3.err,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_1);
                  poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
                  ::std::operator<<(poVar14,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_418,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  iVar8 = 1;
                  goto LAB_001d0d57;
                }
              }
              ::std::__cxx11::string::_M_dispose();
              if (bVar5) {
                ::std::__cxx11::string::string(local_b0,(string *)__lhs);
                ::std::__cxx11::string::string((string *)&ss_e,"scales",(allocator *)&ret_3);
                pPVar15 = (Property *)&ss_e;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          (&ret,(_anonymous_namespace_ *)&table,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_b0,(string *)this,(Property *)&ss_e,(string *)&instancer->scales
                           ,(TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                iVar8 = 0;
                if ((ret.code & ~AlreadyProcessed) == Success) {
                  iVar8 = 3;
LAB_001d0f18:
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (ret.code != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar14 = ::std::operator<<(poVar14,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar14 = ::std::operator<<(poVar14,":");
                    poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                    poVar14 = ::std::operator<<(poVar14,"():");
                    poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf59);
                    ::std::operator<<(poVar14," ");
                    ::std::__cxx11::string::string
                              ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                               (allocator *)&local_3f8);
                    fmt::format<char[7],std::__cxx11::string>
                              ((string *)&ret_3,(fmt *)local_418,(string *)"scales",
                               (char (*) [7])&ret.err,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar15);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                    ::std::operator<<(poVar14,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret_3,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_418,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    iVar8 = 1;
                    goto LAB_001d0f18;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (bVar5) {
                  ::std::__cxx11::string::string(local_d0,(string *)__lhs);
                  ::std::__cxx11::string::string((string *)&ss_e,"velocities",(allocator *)&ret_3);
                  pPVar15 = (Property *)&ss_e;
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                            (&ret,(_anonymous_namespace_ *)&table,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d0,(string *)this,(Property *)&ss_e,
                             (string *)&instancer->velocities,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  iVar8 = 0;
                  if ((ret.code & ~AlreadyProcessed) == Success) {
                    iVar8 = 3;
LAB_001d10d9:
                    bVar5 = false;
                  }
                  else {
                    bVar5 = true;
                    if (ret.code != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar14 = ::std::operator<<(poVar14,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar14 = ::std::operator<<(poVar14,":");
                      poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                      poVar14 = ::std::operator<<(poVar14,"():");
                      poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf5a);
                      ::std::operator<<(poVar14," ");
                      ::std::__cxx11::string::string
                                ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                                 (allocator *)&local_3f8);
                      fmt::format<char[11],std::__cxx11::string>
                                ((string *)&ret_3,(fmt *)local_418,(string *)"velocities",
                                 (char (*) [11])&ret.err,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar15);
                      poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                      ::std::operator<<(poVar14,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret_3,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_418,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)err);
                        ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      iVar8 = 1;
                      goto LAB_001d10d9;
                    }
                  }
                  ::std::__cxx11::string::_M_dispose();
                  if (bVar5) {
                    ::std::__cxx11::string::string(local_f0,(string *)__lhs);
                    ::std::__cxx11::string::string
                              ((string *)&ss_e,"accelerations",(allocator *)&ret_3);
                    pPVar15 = (Property *)&ss_e;
                    (anonymous_namespace)::
                    ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                              (&ret,(_anonymous_namespace_ *)&table,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_f0,(string *)this,(Property *)&ss_e,
                               (string *)&instancer->accelerations,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    iVar8 = 0;
                    if ((ret.code & ~AlreadyProcessed) == Success) {
                      iVar8 = 3;
LAB_001d129a:
                      bVar5 = false;
                    }
                    else {
                      bVar5 = true;
                      if (ret.code != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar14 = ::std::operator<<(poVar14,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar14 = ::std::operator<<(poVar14,":");
                        poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                        poVar14 = ::std::operator<<(poVar14,"():");
                        poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf5b);
                        ::std::operator<<(poVar14," ");
                        ::std::__cxx11::string::string
                                  ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                                   (allocator *)&local_3f8);
                        fmt::format<char[14],std::__cxx11::string>
                                  ((string *)&ret_3,(fmt *)local_418,(string *)"accelerations",
                                   (char (*) [14])&ret.err,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar15);
                        poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                        ::std::operator<<(poVar14,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret_3,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_418,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)err);
                          ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        iVar8 = 1;
                        goto LAB_001d129a;
                      }
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (bVar5) {
                      ::std::__cxx11::string::string(local_110,(string *)__lhs);
                      ::std::__cxx11::string::string
                                ((string *)&ss_e,"angularVelocities",(allocator *)&ret_3);
                      pPVar15 = (Property *)&ss_e;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                (&ret,(_anonymous_namespace_ *)&table,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_110,(string *)this,(Property *)&ss_e,
                                 (string *)&instancer->angularVelocities,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      iVar8 = 0;
                      if ((ret.code & ~AlreadyProcessed) == Success) {
                        iVar8 = 3;
LAB_001d145b:
                        bVar5 = false;
                      }
                      else {
                        bVar5 = true;
                        if (ret.code != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                          poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                          poVar14 = ::std::operator<<(poVar14,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar14 = ::std::operator<<(poVar14,":");
                          poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                          poVar14 = ::std::operator<<(poVar14,"():");
                          poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf5c);
                          ::std::operator<<(poVar14," ");
                          ::std::__cxx11::string::string
                                    ((string *)local_418,"Parsing attribute `{}` failed. Error: {}",
                                     (allocator *)&local_3f8);
                          fmt::format<char[18],std::__cxx11::string>
                                    ((string *)&ret_3,(fmt *)local_418,(string *)"angularVelocities"
                                     ,(char (*) [18])&ret.err,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar15);
                          poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                          ::std::operator<<(poVar14,"\n");
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          if (err != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&ret_3,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_418,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                          iVar8 = 1;
                          goto LAB_001d145b;
                        }
                      }
                      ::std::__cxx11::string::_M_dispose();
                      if (bVar5) {
                        ::std::__cxx11::string::string(local_130,(string *)__lhs);
                        ::std::__cxx11::string::string
                                  ((string *)&ss_e,"invisibleIds",(allocator *)&ret_3);
                        pPVar15 = (Property *)&ss_e;
                        (anonymous_namespace)::
                        ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                                  (&ret,(_anonymous_namespace_ *)&table,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_130,(string *)this,(Property *)&ss_e,
                                   (string *)&instancer->invisibleIds,
                                   (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb4c,uVar7));
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        iVar8 = 0;
                        if ((ret.code & ~AlreadyProcessed) == Success) {
                          iVar8 = 3;
LAB_001d161c:
                          bVar5 = false;
                        }
                        else {
                          bVar5 = true;
                          if (ret.code != Unmatched) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                            poVar14 = ::std::operator<<(poVar14,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar14 = ::std::operator<<(poVar14,":");
                            poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                            poVar14 = ::std::operator<<(poVar14,"():");
                            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf5d);
                            ::std::operator<<(poVar14," ");
                            ::std::__cxx11::string::string
                                      ((string *)local_418,
                                       "Parsing attribute `{}` failed. Error: {}",
                                       (allocator *)&local_3f8);
                            fmt::format<char[13],std::__cxx11::string>
                                      ((string *)&ret_3,(fmt *)local_418,(string *)"invisibleIds",
                                       (char (*) [13])&ret.err,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar15);
                            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_3);
                            ::std::operator<<(poVar14,"\n");
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            if (err != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&ret_3,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_418,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)err);
                              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_3);
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                            }
                            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                            iVar8 = 1;
                            goto LAB_001d161c;
                          }
                        }
                        ::std::__cxx11::string::_M_dispose();
                        if (bVar5) {
                          sVar9 = ::std::
                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::count(&table,(key_type *)__lhs);
                          if (sVar9 == 0) {
                            this_01 = ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      ::operator[](&(instancer->super_GPrim).props,(key_type *)__lhs
                                                  );
                            Property::operator=(this_01,this);
                            ::std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&table,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__lhs);
                          }
                          sVar9 = ::std::
                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::count(&table,(key_type *)__lhs);
                          if (sVar9 == 0) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                            poVar14 = ::std::operator<<(poVar14,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar14 = ::std::operator<<(poVar14,":");
                            poVar14 = ::std::operator<<(poVar14,"ReconstructPrim");
                            poVar14 = ::std::operator<<(poVar14,"():");
                            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0xf60);
                            ::std::operator<<(poVar14," ");
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&ret,"Unsupported/unimplemented property: ",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__lhs);
                            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
                            ::std::operator<<(poVar14,"\n");
                            goto LAB_001d178a;
                          }
                          goto LAB_001d169e;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_001d17ef;
      }
LAB_001d169e:
      p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13);
    }
    bVar4 = true;
  }
  else {
LAB_001d17ec:
    bVar4 = false;
  }
LAB_001d17ef:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar4;
}

Assistant:

bool ReconstructPrim<PointInstancer>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    PointInstancer *instancer,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct PointInstancer.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, instancer, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TARGET_PATHS_RELATION(table, prop, "prototypes", instancer->prototypes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "protoIndices", PointInstancer, instancer->protoIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", PointInstancer, instancer->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "positions", PointInstancer, instancer->positions)
    PARSE_TYPED_ATTRIBUTE(table, prop, "orientations", PointInstancer, instancer->orientations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", PointInstancer, instancer->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", PointInstancer, instancer->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", PointInstancer, instancer->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "angularVelocities", PointInstancer, instancer->angularVelocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "invisibleIds", PointInstancer, instancer->invisibleIds)

    ADD_PROPERTY(table, prop, PointInstancer, instancer->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}